

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool QtPrivate::equalStrings(QLatin1StringView lhs,QStringView rhs)

{
  storage_type_conflict *psVar1;
  byte bVar2;
  storage_type_conflict sVar3;
  storage_type_conflict *psVar4;
  byte *pbVar5;
  int iVar6;
  
  pbVar5 = (byte *)lhs.m_data;
  psVar4 = rhs.m_data;
  psVar1 = psVar4 + rhs.m_size;
  do {
    if (psVar1 <= psVar4) {
      iVar6 = 0;
      break;
    }
    sVar3 = *psVar4;
    bVar2 = *pbVar5;
    psVar4 = psVar4 + 1;
    pbVar5 = pbVar5 + 1;
    iVar6 = (uint)(ushort)sVar3 - (uint)bVar2;
  } while (iVar6 == 0);
  return iVar6 == 0;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}